

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O2

void Aig_ObjOrderRemove(Aig_Man_t *p,int ObjId)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  Aig_Obj_t *pAVar5;
  
  if (ObjId == 0) {
    __assert_fail("ObjId != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOrder.c"
                  ,0x85,"void Aig_ObjOrderRemove(Aig_Man_t *, int)");
  }
  pAVar5 = Aig_ManObj(p,ObjId);
  if (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7) {
    puVar4 = p->pOrderData;
    uVar2 = puVar4[ObjId * 2];
    iVar1 = ObjId * 2 + 1;
    uVar3 = puVar4[iVar1];
    puVar4[ObjId * 2] = 0xffffffff;
    puVar4[iVar1] = 0xffffffff;
    puVar4[(long)(int)uVar3 * 2] = uVar2;
    puVar4[(long)(int)uVar2 * 2 + 1] = uVar3;
    if (p->iPrev == ObjId) {
      p->nAndPrev = p->nAndPrev + -1;
      p->iPrev = uVar2;
    }
    if (p->iNext == ObjId) {
      p->iNext = uVar3;
    }
    p->nAndTotal = p->nAndTotal + -1;
    return;
  }
  __assert_fail("Aig_ObjIsNode( Aig_ManObj(p, ObjId) )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOrder.c"
                ,0x86,"void Aig_ObjOrderRemove(Aig_Man_t *, int)");
}

Assistant:

void Aig_ObjOrderRemove( Aig_Man_t * p, int ObjId )
{
    int iPrev, iNext;
    assert( ObjId != 0 );
    assert( Aig_ObjIsNode( Aig_ManObj(p, ObjId) ) );
    iPrev = p->pOrderData[2*ObjId];
    iNext = p->pOrderData[2*ObjId+1];
    p->pOrderData[2*ObjId] = 0xFFFFFFFF;
    p->pOrderData[2*ObjId+1] = 0xFFFFFFFF;
    p->pOrderData[2*iNext] = iPrev;
    p->pOrderData[2*iPrev+1] = iNext;
    if ( p->iPrev == ObjId )
    {
        p->nAndPrev--;
        p->iPrev = iPrev;
    }
    if ( p->iNext == ObjId )
        p->iNext = iNext;
    p->nAndTotal--;
}